

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

void StringFormatter<unsigned_long&,unsigned_long,unsigned_long&,unsigned_long,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_char&,unsigned_short&,unsigned_int&,unsigned_long&>
     ::
     format<unsigned_long,unsigned_long&,unsigned_long&,unsigned_char&,unsigned_short&,unsigned_int&,unsigned_long&>
               (ostream *os,char *fmt,unsigned_long *value,unsigned_long *args,unsigned_long *args_1
               ,uchar *args_2,unsigned_short *args_3,uint *args_4,unsigned_long *args_5)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  runtime_error *this;
  char *__nptr;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  uint uVar11;
  ostream local_82;
  long local_78;
  int local_50;
  char *q;
  
  do {
    cVar4 = *fmt;
    if (cVar4 == '%') {
      cVar1 = fmt[1];
      cVar4 = '%';
      lVar5 = 2;
      if (cVar1 != '%') {
        cVar4 = fmt[(ulong)(cVar1 == '-') + 1];
        lVar5 = (ulong)(cVar4 == ' ' || cVar4 == '+') + (ulong)(cVar1 == '-');
        __nptr = fmt + lVar5 + 1;
        if (*__nptr == ',') {
          __nptr = fmt + lVar5 + 2;
          local_82 = (ostream)0x2c;
        }
        else if (*__nptr == '0') {
          __nptr = fmt + lVar5 + 2;
          local_82 = (ostream)0x30;
        }
        else {
          local_82 = (ostream)0x20;
        }
        lVar5 = strtol(__nptr,&q,10);
        pcVar3 = q;
        if (*q == '.') {
          pcVar8 = q + 1;
          lVar6 = strtol(pcVar8,&q,10);
          bVar10 = pcVar8 != q;
          local_78 = (long)(int)lVar6;
        }
        else {
          local_78 = 0;
          bVar10 = false;
        }
        do {
          pcVar8 = q;
          cVar2 = *pcVar8;
          pvVar7 = memchr("qhlLzjt",(int)cVar2,8);
          q = pcVar8 + 1;
        } while (pvVar7 != (void *)0x0);
        pcVar9 = pcVar8;
        if ((cVar2 == 'I') && (pcVar9 = pcVar8 + 1, (byte)(pcVar8[2] | 2U) == 0x36)) {
          pcVar9 = pcVar8 + 3;
        }
        cVar2 = *pcVar9;
        StringFormatter<unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_char_&,_unsigned_short_&,_unsigned_int_&,_unsigned_long_&>
        ::applytype(os,cVar2);
        lVar6 = *(long *)os;
        if (cVar4 == '+') {
          os[*(long *)(lVar6 + -0x18) + 0x19] =
               (ostream)((byte)os[*(long *)(lVar6 + -0x18) + 0x19] | 8);
          if (cVar1 == '-') goto LAB_0010d389;
          uVar11 = 0x10;
        }
        else {
          os[*(long *)(lVar6 + -0x18) + 0x19] =
               (ostream)((byte)os[*(long *)(lVar6 + -0x18) + 0x19] & 0xf7);
          if (cVar1 != '-') goto LAB_0010d3a0;
LAB_0010d389:
          uVar11 = 0x20;
        }
        *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) =
             *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffff4f | uVar11;
LAB_0010d3a0:
        if (__nptr == pcVar3) {
          *(undefined8 *)(os + *(long *)(lVar6 + -0x18) + 0x10) = 0;
        }
        else {
          local_50 = (int)lVar5;
          *(long *)(os + *(long *)(lVar6 + -0x18) + 0x10) = (long)local_50;
          if (cVar1 != '-' && cVar4 != '+') {
            *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) =
                 *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffff4f | 0x80;
          }
        }
        if (bVar10) {
          *(long *)(os + *(long *)(lVar6 + -0x18) + 8) = local_78;
        }
        lVar5 = *(long *)(lVar6 + -0x18);
        std::ios::fill();
        os[lVar5 + 0xe0] = local_82;
        if ((cVar2 != 'c') ||
           (bVar10 = StringFormatter<unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_char_&,_unsigned_short_&,_unsigned_int_&,_unsigned_long_&>
                     ::output_wchar<unsigned_long>(os,value), !bVar10)) {
          pvVar7 = memchr("iduoxX",(int)cVar2,7);
          if (pvVar7 == (void *)0x0) {
            bVar10 = StringFormatter<unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_char_&,_unsigned_short_&,_unsigned_int_&,_unsigned_long_&>
                     ::output_using_operator<unsigned_long>(os,value);
            if (!bVar10) {
              std::operator<<(os,"<?>");
            }
          }
          else {
            std::ostream::_M_insert<unsigned_long>((ulong)os);
          }
        }
        *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 0;
        format<unsigned_long,unsigned_long&,unsigned_char&,unsigned_short&,unsigned_int&,unsigned_long&>
                  (os,pcVar9 + (cVar2 != '\0'),args,args_1,args_2,args_3,args_4,args_5);
        return;
      }
    }
    else {
      lVar5 = 1;
      if (cVar4 == '\0') {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"too many arguments for format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    fmt = fmt + lVar5;
    std::operator<<(os,cVar4);
  } while( true );
}

Assistant:

static void format(std::ostream& os, const char *fmt, T& value, FARGS&&...args) 
    {
        bool used_value = false;
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {

                    // '-'  means left adjust
                    bool leftadjust= false;
                    if (*p=='-') {
                        p++;
                        leftadjust= true;
                    }
                    bool forcesign= false;
                    //bool blankforpositive= false;
                    if (*p=='+') {
                        p++;
                        forcesign= true;
                    }
                    else if (*p==' ') {
                        p++;
                        //blankforpositive= true;  // <-- todo
                    }
                    
                    // '0' means pad with zero
                    // ',' is useful for arrays
                    char padchar= ' ';

                    if (*p=='0') { p++; padchar='0'; }
                    else if (*p==',') { p++; padchar=','; }

                    // width specification
                    char *q;
                    // todo: support '*'  : take size from argumentlist.
                    // todo: support '#'  : adds 0, 0x, 0X prefix to oct/hex numbers -> 'showbase'
                    int width= strtol(p, &q, 10);
                    bool havewidth= p!=q;
                    p= q;

                    // precision after '.'
                    int precision= 0;
                    bool haveprecision= false;
                    if (*p=='.') {
                        p++;
                        // todo: support '*'
                        precision= strtol(p, &q, 10);
                        haveprecision= p!=q;
                        p= q;
                    }

                    // ignore argument size field
                    while (std::strchr("qhlLzjt", *p))
                        p++;
                    if (*p=='I') {
                        // microsoft I64 specifier
                        p++;
                        if (p[1]=='6' || p[1]=='4') {
                            p+=2;
                        }
                    }

                    char type= 0;
                    if (*p)
                        type= *p++;

                    // use formatting
                    applytype(os, type);
                    if (forcesign)
                        os << std::showpos;
                    else
                        os << std::noshowpos;

                    if (leftadjust)
                        os << std::left;
                    else if (forcesign) {
                        // exception: when forcing display of sign
                        // we need to use 'internal fill'
                        os << std::internal;
                    }

                    if (havewidth) {
                        os.width(width);
                        if (!leftadjust && !forcesign)
                            os << std::right;
                    }
                    else {
                        os.width(0);
                    }
                    // todo: support precision(truncate) for strings
                    if (haveprecision)
                        os.precision(precision);
                    os.fill(padchar);

                    if (type=='c' && output_wchar(os, value))
                    {
                        // nop
                    }
                    else if (type=='p' && output_pointer(os, value))
                    {
                        // nop
                    }
                    else if (type=='b' && output_hex_data(os, value))
                    {
                        // nop
                    }
                    else if (std::strchr("iduoxX", type) && output_int(os, value))
                    {
                        // nop
                    }
                    else if (type=='s' && output_null(os, value))
                    {
                        // nop
                    }
                    else if (output_using_operator(os, value))
                    {
                        // when type ~ float/double : '[AEFGaefg]' || type == 's' || other outputs failed.
                        // nop
                    }
                    else {
                        os << "<?>";
                    }

                    // TODO: improve float formatting

                    // reset precision
                    os.precision(0);

                    used_value = true;

                    format(os, p, args...);
                    return;
                }
            }
            else {
                os << *p++;
            }
        }

        if (!used_value)
            throw std::runtime_error("too many arguments for format");
    }